

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O0

void __thiscall
TPZMeshSolution::Execute
          (TPZMeshSolution *this,TPZVec<double> *x,TPZVec<double> *f,TPZFMatrix<double> *df)

{
  int64_t iVar1;
  double *pdVar2;
  TPZFMatrix<double> *this_00;
  TPZBaseMatrix *in_RCX;
  TPZVec<double> *in_RDX;
  long in_RDI;
  int d;
  int is;
  int maxd;
  TPZManVector<double,_10> dsol;
  TPZManVector<double,_10> sol;
  TPZCompEl *cel;
  TPZGeoEl *gel;
  TPZManVector<double,_3> xcopy;
  int64_t in_stack_fffffffffffffe28;
  TPZGeoMesh *in_stack_fffffffffffffe30;
  int64_t in_stack_fffffffffffffe48;
  _func_int **row;
  TPZManVector<double,_10> *in_stack_fffffffffffffe50;
  TPZVec<double> *in_stack_fffffffffffffe68;
  TPZManVector<double,_3> *in_stack_fffffffffffffe70;
  int local_164;
  int local_160;
  int local_15c;
  TPZVec<double> local_158 [3];
  TPZVec<double> local_e8 [3];
  TPZCompEl *local_78;
  TPZGeoEl *local_70;
  TPZBaseMatrix *local_20;
  TPZVec<double> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  TPZCompMesh::Reference(*(TPZCompMesh **)(in_RDI + 8));
  TPZGeoMesh::FindElement
            ((TPZGeoMesh *)sol.super_TPZVec<double>.fNElements,
             (TPZVec<double> *)sol.super_TPZVec<double>.fStore,
             (TPZVec<double> *)sol.super_TPZVec<double>._vptr_TPZVec,(int64_t *)dsol.fExtAlloc[9],
             dsol.fExtAlloc[8]._4_4_);
  TPZCompMesh::Reference(*(TPZCompMesh **)(in_RDI + 8));
  local_70 = TPZGeoMesh::Element(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_78 = TPZGeoEl::Reference(local_70);
  TPZManVector<double,_10>::TPZManVector(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  TPZManVector<double,_10>::TPZManVector(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  (**(code **)(*(long *)local_78 + 0x1b0))
            (local_78,in_RDI + 0x18,*(undefined4 *)(in_RDI + 0x54),local_e8);
  (**(code **)(*(long *)local_78 + 0x1b0))
            (local_78,in_RDI + 0x18,*(undefined4 *)(in_RDI + 0x58),local_158);
  local_15c = 3;
  iVar1 = TPZBaseMatrix::Rows(local_20);
  if (iVar1 < 3) {
    iVar1 = TPZBaseMatrix::Rows(local_20);
    local_15c = (int)iVar1;
  }
  for (local_160 = 0; local_160 < *(int *)(in_RDI + 0x5c); local_160 = local_160 + 1) {
    pdVar2 = TPZVec<double>::operator[](local_e8,(long)local_160);
    row = (_func_int **)*pdVar2;
    this_00 = (TPZFMatrix<double> *)TPZVec<double>::operator[](local_18,(long)local_160);
    (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = row;
    for (local_164 = 0; local_164 < local_15c; local_164 = local_164 + 1) {
      pdVar2 = TPZVec<double>::operator[](local_158,(long)(local_160 * 3 + local_164));
      in_stack_fffffffffffffe30 = (TPZGeoMesh *)*pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)row,(int64_t)pdVar2);
      *pdVar2 = (double)in_stack_fffffffffffffe30;
    }
  }
  TPZManVector<double,_10>::~TPZManVector((TPZManVector<double,_10> *)in_stack_fffffffffffffe30);
  TPZManVector<double,_10>::~TPZManVector((TPZManVector<double,_10> *)in_stack_fffffffffffffe30);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffe30);
  return;
}

Assistant:

void TPZMeshSolution::Execute(const TPZVec<REAL> &x, TPZVec<STATE> &f, TPZFMatrix<STATE> &df)
{
    TPZManVector<REAL,3> xcopy(x);
    fMesh->Reference()->FindElement(xcopy, fLastLoc, fGeoElIndex, fDimension);
    TPZGeoEl *gel = fMesh->Reference()->Element(fGeoElIndex);
    TPZCompEl *cel = gel->Reference();
    TPZManVector<STATE> sol(1), dsol(3);
    cel->Solution(fLastLoc,fSolutionVarindex,sol);
    cel->Solution(fLastLoc,fGradVarindex,dsol);
    int maxd = 3;
    if (df.Rows() < 3) {
        maxd = df.Rows();
    }
    for (int is=0; is<fNumSolutions; is++) {
        f[is] = sol[is];
        for (int d=0; d<maxd; d++) {
            df(d,is) = dsol[is*3+d];
        }
    }
}